

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O1

bool __thiscall
QDBusConnectionPrivate::shouldWatchService(QDBusConnectionPrivate *this,QString *service)

{
  long lVar1;
  byte bVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  if ((this->mode == ClientMode) && (lVar1 = (service->d).size, lVar1 != 0)) {
    if (lVar1 == 0x14) {
      QVar3.m_data = (service->d).ptr;
      QVar3.m_size = 0x14;
      QVar4.m_data = L"org.freedesktop.DBus";
      QVar4.m_size = 0x14;
      bVar2 = QtPrivate::equalStrings(QVar3,QVar4);
      return (bool)(bVar2 ^ 1);
    }
    return true;
  }
  return false;
}

Assistant:

bool QDBusConnectionPrivate::shouldWatchService(const QString &service)
{
    // we don't have to watch anything in peer mode
    if (mode != ClientMode)
        return false;
    // we don't have to watch wildcard services (empty strings)
    if (service.isEmpty())
        return false;
    // we don't have to watch the bus driver
    if (service == QDBusUtil::dbusService())
        return false;
    return true;
}